

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O1

double __thiscall CEDate::GetDate(CEDate *this,CEDateType time_format)

{
  invalid_value *this_00;
  double extraout_XMM0_Qa;
  string local_68;
  string local_48;
  
  if (time_format < (GREGORIAN|MJD)) {
    (*this->_vptr_CEDate[(ulong)time_format + 4])();
    return extraout_XMM0_Qa;
  }
  this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CEDate::GetDate()","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Unrecognized time format!","");
  CEException::invalid_value::invalid_value(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

double CEDate::GetDate(CEDateType time_format) const
{
    // Initialize the return date
    double date(0);

    // Return the julian date if requested
    if (time_format == CEDateType::JD) {
        date = JD() ;
    } else if (time_format == CEDateType::MJD) {
        date = MJD() ;
    } else if (time_format == CEDateType::GREGORIAN) {
        date = Gregorian() ;
    } else {
        throw CEException::invalid_value("CEDate::GetDate()", 
                                         "Unrecognized time format!");
    }

    return date;
}